

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::BxDFHandle::rho
          (BxDFHandle *this,span<const_pbrt::Point2<float>_> u1,span<const_float> uc,
          span<const_pbrt::Point2<float>_> u2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  BSDFSample *pBVar5;
  BSDFSample *pBVar6;
  Point2f *u;
  size_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  float fVar14;
  float in_XMM1_Db;
  undefined8 in_XMM1_Qb;
  undefined8 uVar15;
  undefined1 in_XMM4 [16];
  SampledSpectrum SVar16;
  Vector3f wo;
  SampledSpectrum r;
  SampledSpectrum local_90;
  SampledSpectrum local_80;
  SampledSpectrum local_70;
  optional<pbrt::BSDFSample> bs;
  
  u = u1.ptr;
  SampledSpectrum::SampledSpectrum(&r,0.0);
  for (sVar7 = 0; uc.n != sVar7; sVar7 = sVar7 + 1) {
    wo = SampleUniformHemisphere(u);
    fVar14 = wo.super_Tuple3<pbrt::Vector3,_float>.z;
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      auVar9._4_4_ = in_XMM1_Db;
      auVar9._0_4_ = fVar14;
      uVar15 = in_XMM1_Qb;
      Sample_f(&bs,this,wo,uc.ptr[sVar7],(Point2f)u2.ptr[sVar7].super_Tuple2<pbrt::Point2,_float>,
               Radiance,All);
      if (bs.set == true) {
        pBVar5 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        pBVar6 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        auVar8._8_4_ = 0x7fffffff;
        auVar8._0_8_ = 0x7fffffff7fffffff;
        auVar8._12_4_ = 0x7fffffff;
        auVar8 = vandps_avx512vl(ZEXT416((uint)(pBVar6->wi).super_Tuple3<pbrt::Vector3,_float>.z),
                                 auVar8);
        auVar13 = ZEXT856(auVar8._8_8_);
        SVar16 = SampledSpectrum::operator*(&pBVar5->f,auVar8._0_4_);
        auVar10._0_8_ = SVar16.values.values._0_8_;
        auVar10._8_56_ = auVar13;
        auVar2._8_8_ = uVar15;
        auVar2._0_8_ = SVar16.values.values._8_8_;
        local_90.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar2);
        auVar9._8_8_ = in_XMM1_Qb;
        auVar1._8_4_ = 0x7fffffff;
        auVar1._0_8_ = 0x7fffffff7fffffff;
        auVar1._12_4_ = 0x7fffffff;
        auVar9 = vandps_avx512vl(auVar9,auVar1);
        auVar13 = ZEXT856(auVar9._8_8_);
        SVar16 = SampledSpectrum::operator*(&local_90,auVar9._0_4_);
        auVar11._0_8_ = SVar16.values.values._0_8_;
        auVar11._8_56_ = auVar13;
        auVar3._8_8_ = uVar15;
        auVar3._0_8_ = SVar16.values.values._8_8_;
        local_80.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar3);
        pBVar5 = pstd::optional<pbrt::BSDFSample>::value(&bs);
        auVar13 = (undefined1  [56])0x0;
        SVar16 = SampledSpectrum::operator/(&local_80,pBVar5->pdf * 0.15915494);
        in_XMM1_Db = SVar16.values.values[3];
        auVar12._0_8_ = SVar16.values.values._0_8_;
        auVar12._8_56_ = auVar13;
        auVar4._8_8_ = uVar15;
        auVar4._0_8_ = SVar16.values.values._8_8_;
        local_70.values.values = (array<float,_4>)vmovlhps_avx(auVar12._0_16_,auVar4);
        SampledSpectrum::operator+=(&r,&local_70);
      }
      in_XMM1_Qb = uVar15;
      pstd::optional<pbrt::BSDFSample>::~optional(&bs);
    }
    u = u + 1;
  }
  auVar9 = vcvtusi2ss_avx512f(in_XMM4,uc.n);
  SVar16 = SampledSpectrum::operator/(&r,auVar9._0_4_ * 3.1415927);
  return (array<float,_4>)(array<float,_4>)SVar16;
}

Assistant:

SampledSpectrum BxDFHandle::rho(pstd::span<const Point2f> u1, pstd::span<const Float> uc,
                                pstd::span<const Point2f> u2) const {
    DCHECK_EQ(uc.size(), u1.size());
    DCHECK_EQ(u1.size(), u2.size());
    SampledSpectrum r(0.f);
    for (size_t i = 0; i < uc.size(); ++i) {
        // Compute estimate of of $\rho_\roman{hh}$
        Vector3f wo = SampleUniformHemisphere(u1[i]);
        if (wo.z == 0)
            continue;
        Float pdfo = UniformHemispherePDF();
        pstd::optional<BSDFSample> bs = Sample_f(wo, uc[i], u2[i]);
        if (bs)
            r += bs->f * AbsCosTheta(bs->wi) * AbsCosTheta(wo) / (pdfo * bs->pdf);
    }
    return r / (Pi * uc.size());
}